

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

bool __thiscall duckdb_re2::DFA::InlinedSearchLoop<false,false,true>(DFA *this,SearchParams *params)

{
  byte *pbVar1;
  byte bVar2;
  size_type sVar3;
  bool bVar4;
  uint uVar5;
  State *pSVar6;
  State *pSVar7;
  byte *pbVar8;
  State *pSVar9;
  long lVar10;
  int *__dest;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  size_t sVar14;
  bool bVar15;
  byte *pbVar16;
  uint c;
  byte *local_248;
  State *local_238;
  int *local_230;
  int *local_228;
  StateSaver local_208;
  Prog *local_1e0;
  StateSaver local_1d8;
  undefined1 local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  pSVar6 = params->start;
  pbVar13 = (byte *)(params->text).data_;
  sVar3 = (params->text).size_;
  local_1e0 = this->prog_;
  if ((pSVar6->flag_ & 0x100) == 0) {
    local_248 = (byte *)0x0;
    bVar15 = false;
  }
  else {
    bVar15 = true;
    local_248 = pbVar13;
    if (((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) &&
       (0 < (long)pSVar6->ninst_)) {
      uVar11 = (long)pSVar6->ninst_ + 1;
      do {
        if (pSVar6->inst_[uVar11 - 2] == -2) break;
        SparseSetT<void>::InsertInternal(params->matches,true,pSVar6->inst_[uVar11 - 2]);
        uVar11 = uVar11 - 1;
      } while (1 < uVar11);
    }
  }
  pbVar1 = pbVar13 + sVar3;
  if (sVar3 != 0) {
    pbVar16 = (byte *)0x0;
    pbVar8 = pbVar13;
    pSVar9 = pSVar6;
    local_238 = pSVar6;
    do {
      pbVar12 = pbVar8 + 1;
      bVar2 = *pbVar8;
      pSVar6 = pSVar9->next_[local_1e0->bytemap_[bVar2]]._M_b._M_p;
      if (pSVar6 == (State *)0x0) {
        pSVar6 = RunStateOnByteUnlocked(this,pSVar9,(uint)bVar2);
        if (pSVar6 == (State *)0x0) {
          if (((dfa_should_bail_when_slow == '\x01') && (pbVar16 != (byte *)0x0)) &&
             (((ulong)((long)pbVar12 - (long)pbVar16) <
               (this->state_cache_)._M_h._M_element_count * 10 && (this->kind_ != kManyMatch)))) {
            params->failed = true;
            return false;
          }
          if ((State *)&DAT_00000002 < local_238) {
            local_208.is_special_ = false;
            local_208.special_ = (State *)0x0;
            local_208.ninst_ = local_238->ninst_;
            local_208.flag_ = local_238->flag_;
            lVar10 = (long)local_208.ninst_;
            sVar14 = lVar10 * 4;
            if (local_208.ninst_ < 0) {
              sVar14 = 0xffffffffffffffff;
            }
            local_208.dfa_ = this;
            local_228 = (int *)operator_new__(sVar14);
            local_208.inst_ = local_228;
            memmove(local_228,local_238->inst_,lVar10 * 4);
          }
          else {
            local_208.inst_ = (int *)0x0;
            local_208.ninst_ = 0;
            local_208.flag_ = 0;
            local_208.is_special_ = true;
            local_208.special_ = local_238;
            local_228 = (int *)0x0;
            local_208.dfa_ = this;
          }
          local_1d8.dfa_ = this;
          if ((State *)&DAT_00000002 < pSVar9) {
            local_1d8.is_special_ = false;
            local_1d8.special_ = (State *)0x0;
            local_1d8.ninst_ = pSVar9->ninst_;
            local_1d8.flag_ = pSVar9->flag_;
            lVar10 = (long)local_1d8.ninst_;
            sVar14 = lVar10 * 4;
            if (local_1d8.ninst_ < 0) {
              sVar14 = 0xffffffffffffffff;
            }
            local_230 = (int *)operator_new__(sVar14);
            local_1d8.inst_ = local_230;
            memmove(local_230,pSVar9->inst_,lVar10 * 4);
          }
          else {
            local_1d8.inst_ = (int *)0x0;
            local_1d8.ninst_ = 0;
            local_1d8.flag_ = 0;
            local_1d8.is_special_ = true;
            local_230 = (int *)0x0;
            local_1d8.special_ = pSVar9;
          }
          ResetCache(this,params->cache_lock);
          pSVar7 = StateSaver::Restore(&local_208);
          if ((pSVar7 == (State *)0x0) ||
             (pSVar6 = StateSaver::Restore(&local_1d8), pSVar6 == (State *)0x0)) {
LAB_00485f46:
            params->failed = true;
            bVar4 = false;
            pSVar6 = (State *)0x0;
          }
          else {
            pSVar6 = RunStateOnByteUnlocked(this,pSVar6,(uint)bVar2);
            if (pSVar6 == (State *)0x0) {
              local_1b0 = 0;
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"RunStateOnByteUnlocked failed after ResetCache",0x2e)
              ;
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
              std::ios_base::~ios_base(local_138);
              goto LAB_00485f46;
            }
            bVar4 = true;
          }
          if (((State *)&DAT_00000002 < pSVar9) && (local_230 != (int *)0x0)) {
            operator_delete__(local_230);
          }
          if (((State *)&DAT_00000002 < local_238) && (local_228 != (int *)0x0)) {
            operator_delete__(local_228);
          }
          pbVar16 = pbVar12;
          local_238 = pSVar7;
          if (!bVar4) {
            return false;
          }
        }
      }
      if (pSVar6 < (State *)&DAT_00000003) {
        if (pSVar6 == (State *)0x1) {
          params->ep = (char *)local_248;
          return bVar15;
        }
        goto LAB_004861b8;
      }
      if (((((pSVar6->flag_ & 0x100) != 0) &&
           (bVar15 = true, local_248 = pbVar8, params->matches != (SparseSet *)0x0)) &&
          (this->kind_ == kManyMatch)) && (0 < (long)pSVar6->ninst_)) {
        uVar11 = (long)pSVar6->ninst_ + 1;
        do {
          if (pSVar6->inst_[uVar11 - 2] == -2) break;
          SparseSetT<void>::InsertInternal(params->matches,true,pSVar6->inst_[uVar11 - 2]);
          uVar11 = uVar11 - 1;
        } while (1 < uVar11);
      }
      pbVar13 = pbVar1;
      pbVar8 = pbVar12;
      pSVar9 = pSVar6;
    } while (pbVar12 != pbVar1);
  }
  pbVar8 = (byte *)((params->text).data_ + (params->text).size_);
  if (pbVar8 == (byte *)((params->context).data_ + (params->context).size_)) {
    uVar5 = this->prog_->bytemap_range_;
    c = 0x100;
  }
  else {
    bVar2 = *pbVar8;
    c = (uint)bVar2;
    uVar5 = (uint)this->prog_->bytemap_[bVar2];
  }
  pSVar9 = pSVar6->next_[(int)uVar5]._M_b._M_p;
  if ((pSVar9 != (State *)0x0) ||
     (pSVar9 = RunStateOnByteUnlocked(this,pSVar6,c), pSVar9 != (State *)0x0)) goto LAB_0048615a;
  if ((State *)&DAT_00000002 < pSVar6) {
    local_208.is_special_ = false;
    local_208.special_ = (State *)0x0;
    local_208.ninst_ = pSVar6->ninst_;
    local_208.flag_ = pSVar6->flag_;
    lVar10 = (long)local_208.ninst_;
    uVar11 = 0xffffffffffffffff;
    if (-1 < local_208.ninst_) {
      uVar11 = lVar10 * 4;
    }
    local_208.dfa_ = this;
    __dest = (int *)operator_new__(uVar11);
    local_208.inst_ = __dest;
    memmove(__dest,pSVar6->inst_,lVar10 * 4);
  }
  else {
    local_208.inst_ = (int *)0x0;
    local_208.ninst_ = 0;
    local_208.flag_ = 0;
    local_208.is_special_ = true;
    __dest = (int *)0x0;
    local_208.dfa_ = this;
    local_208.special_ = pSVar6;
  }
  ResetCache(this,params->cache_lock);
  pSVar9 = StateSaver::Restore(&local_208);
  if (pSVar9 == (State *)0x0) {
LAB_00486135:
    params->failed = true;
    bVar4 = false;
    pSVar9 = (State *)0x0;
  }
  else {
    pSVar9 = RunStateOnByteUnlocked(this,pSVar9,c);
    if (pSVar9 == (State *)0x0) {
      local_1b0 = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"RunStateOnByteUnlocked failed after Reset",0x29);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      goto LAB_00486135;
    }
    bVar4 = true;
  }
  if (((State *)&DAT_00000002 < pSVar6) && (__dest != (int *)0x0)) {
    operator_delete__(__dest);
  }
  if (!bVar4) {
    return false;
  }
LAB_0048615a:
  if (pSVar9 < (State *)&DAT_00000003) {
    if (pSVar9 != (State *)0x1) {
LAB_004861b8:
      params->ep = (char *)pbVar1;
      return true;
    }
  }
  else if (((((pSVar9->flag_ & 0x100) != 0) &&
            (bVar15 = true, local_248 = pbVar13, params->matches != (SparseSet *)0x0)) &&
           (this->kind_ == kManyMatch)) && (0 < (long)pSVar9->ninst_)) {
    uVar11 = (long)pSVar9->ninst_ + 1;
    do {
      if (pSVar9->inst_[uVar11 - 2] == -2) break;
      SparseSetT<void>::InsertInternal(params->matches,true,pSVar9->inst_[uVar11 - 2]);
      uVar11 = uVar11 - 1;
    } while (1 < uVar11);
  }
  params->ep = (char *)local_248;
  return bVar15;
}

Assistant:

inline bool DFA::InlinedSearchLoop(SearchParams* params) {
  State* start = params->start;
  const uint8_t* bp = BytePtr(params->text.data());  // start of text
  const uint8_t* p = bp;                             // text scanning point
  const uint8_t* ep = BytePtr(params->text.data() +
                              params->text.size());  // end of text
  const uint8_t* resetp = NULL;                      // p at last cache reset
  if (!run_forward) {
    using std::swap;
    swap(p, ep);
  }

  const uint8_t* bytemap = prog_->bytemap();
  const uint8_t* lastmatch = NULL;   // most recent matching position in text
  bool matched = false;

  State* s = start;

  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
    if (want_earliest_match) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return true;
    }
  }

  while (p != ep) {

    if (can_prefix_accel && s == start) {
      // In start state, only way out is to find the prefix,
      // so we use prefix accel (e.g. memchr) to skip ahead.
      // If not found, we can skip to the end of the string.
      p = BytePtr(prog_->PrefixAccel(p, ep - p));
      if (p == NULL) {
        p = ep;
        break;
      }
    }

    int c;
    if (run_forward)
      c = *p++;
    else
      c = *--p;

    // Note that multiple threads might be consulting
    // s->next_[bytemap[c]] simultaneously.
    // RunStateOnByte takes care of the appropriate locking,
    // including a memory barrier so that the unlocked access
    // (sometimes known as "double-checked locking") is safe.
    // The alternative would be either one DFA per thread
    // or one mutex operation per input byte.
    //
    // ns == DeadState means the state is known to be dead
    // (no more matches are possible).
    // ns == NULL means the state has not yet been computed
    // (need to call RunStateOnByteUnlocked).
    // RunStateOnByte returns ns == NULL if it is out of memory.
    // ns == FullMatchState means the rest of the string matches.
    //
    // Okay to use bytemap[] not ByteMap() here, because
    // c is known to be an actual byte and not kByteEndText.

    State* ns = s->next_[bytemap[c]].load(std::memory_order_acquire);
    if (ns == NULL) {
      ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        // After we reset the cache, we hold cache_mutex exclusively,
        // so if resetp != NULL, it means we filled the DFA state
        // cache with this search alone (without any other threads).
        // Benchmarks show that doing a state computation on every
        // byte runs at about 0.2 MB/s, while the NFA (nfa.cc) can do the
        // same at about 2 MB/s.  Unless we're processing an average
        // of 10 bytes per state computation, fail so that RE2 can
        // fall back to the NFA.  However, RE2::Set cannot fall back,
        // so we just have to keep on keeping on in that case.
        if (dfa_should_bail_when_slow && resetp != NULL &&
            static_cast<size_t>(p - resetp) < 10*state_cache_.size() &&
            kind_ != Prog::kManyMatch) {
          params->failed = true;
          return false;
        }
        resetp = p;

        // Prepare to save start and s across the reset.
        StateSaver save_start(this, start);
        StateSaver save_s(this, s);

        // Discard all the States in the cache.
        ResetCache(params->cache_lock);

        // Restore start and s so we can continue.
        if ((start = save_start.Restore()) == NULL ||
            (s = save_s.Restore()) == NULL) {
          // Restore already did LOG(DFATAL).
          params->failed = true;
          return false;
        }
        ns = RunStateOnByteUnlocked(s, c);
        if (ns == NULL) {
          LOG(DFATAL) << "RunStateOnByteUnlocked failed after ResetCache";
          params->failed = true;
          return false;
        }
      }
    }
    if (ns <= SpecialStateMax) {
      if (ns == DeadState) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return matched;
      }
      // FullMatchState
      params->ep = reinterpret_cast<const char*>(ep);
      return true;
    }

    s = ns;
    if (s->IsMatch()) {
      matched = true;
      // The DFA notices the match one byte late,
      // so adjust p before using it in the match.
      if (run_forward)
        lastmatch = p - 1;
      else
        lastmatch = p + 1;
      if (params->matches != NULL && kind_ == Prog::kManyMatch) {
        for (int i = s->ninst_ - 1; i >= 0; i--) {
          int id = s->inst_[i];
          if (id == MatchSep)
            break;
          params->matches->insert(id);
        }
      }
      if (want_earliest_match) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return true;
      }
    }
  }

  // Process one more byte to see if it triggers a match.
  // (Remember, matches are delayed one byte.)

  int lastbyte;
  if (run_forward) {
    if (EndPtr(params->text) == EndPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = EndPtr(params->text)[0] & 0xFF;
  } else {
    if (BeginPtr(params->text) == BeginPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = BeginPtr(params->text)[-1] & 0xFF;
  }

  State* ns = s->next_[ByteMap(lastbyte)].load(std::memory_order_acquire);
  if (ns == NULL) {
    ns = RunStateOnByteUnlocked(s, lastbyte);
    if (ns == NULL) {
      StateSaver save_s(this, s);
      ResetCache(params->cache_lock);
      if ((s = save_s.Restore()) == NULL) {
        params->failed = true;
        return false;
      }
      ns = RunStateOnByteUnlocked(s, lastbyte);
      if (ns == NULL) {
        LOG(DFATAL) << "RunStateOnByteUnlocked failed after Reset";
        params->failed = true;
        return false;
      }
    }
  }
  if (ns <= SpecialStateMax) {
    if (ns == DeadState) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return matched;
    }
    // FullMatchState
    params->ep = reinterpret_cast<const char*>(ep);
    return true;
  }

  s = ns;
  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
  }

  params->ep = reinterpret_cast<const char*>(lastmatch);
  return matched;
}